

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvram.cpp
# Opt level: O0

CBString * vssAttributesToUString(CBString *__return_storage_ptr__,UINT32 attributes)

{
  CBString local_100;
  CBString local_e8;
  CBString local_d0;
  CBString local_b8;
  CBString local_a0;
  CBString local_88;
  CBString local_70;
  CBString local_58;
  CBString local_30;
  undefined1 local_15;
  uint local_14;
  CBString *pCStack_10;
  UINT32 attributes_local;
  CBString *str;
  
  local_15 = 0;
  local_14 = attributes;
  pCStack_10 = __return_storage_ptr__;
  Bstrlib::CBString::CBString(__return_storage_ptr__);
  if ((local_14 & 1) != 0) {
    Bstrlib::CBString::CBString(&local_30,", NonVolatile");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_30);
    Bstrlib::CBString::~CBString(&local_30);
  }
  if ((local_14 & 2) != 0) {
    Bstrlib::CBString::CBString(&local_58,", BootService");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_58);
    Bstrlib::CBString::~CBString(&local_58);
  }
  if ((local_14 & 4) != 0) {
    Bstrlib::CBString::CBString(&local_70,", Runtime");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_70);
    Bstrlib::CBString::~CBString(&local_70);
  }
  if ((local_14 & 8) != 0) {
    Bstrlib::CBString::CBString(&local_88,", HwErrorRecord");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_88);
    Bstrlib::CBString::~CBString(&local_88);
  }
  if ((local_14 & 0x10) != 0) {
    Bstrlib::CBString::CBString(&local_a0,", AuthWrite");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_a0);
    Bstrlib::CBString::~CBString(&local_a0);
  }
  if ((local_14 & 0x20) != 0) {
    Bstrlib::CBString::CBString(&local_b8,", TimeBasedAuthWrite");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_b8);
    Bstrlib::CBString::~CBString(&local_b8);
  }
  if ((local_14 & 0x40) != 0) {
    Bstrlib::CBString::CBString(&local_d0,", AppendWrite");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_d0);
    Bstrlib::CBString::~CBString(&local_d0);
  }
  if ((local_14 & 0x80000000) != 0) {
    Bstrlib::CBString::CBString(&local_e8,", AppleChecksum");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_e8);
    Bstrlib::CBString::~CBString(&local_e8);
  }
  if ((local_14 & 0x7fffff80) != 0) {
    Bstrlib::CBString::CBString(&local_100,", Unknown");
    Bstrlib::CBString::operator+=(__return_storage_ptr__,&local_100);
    Bstrlib::CBString::~CBString(&local_100);
  }
  Bstrlib::CBString::remove(__return_storage_ptr__,(char *)0x0);
  return __return_storage_ptr__;
}

Assistant:

extern UString vssAttributesToUString(const UINT32 attributes)
{
    UString str;
    if (attributes & NVRAM_VSS_VARIABLE_NON_VOLATILE)                          str += UString(", NonVolatile");
    if (attributes & NVRAM_VSS_VARIABLE_BOOTSERVICE_ACCESS)                    str += UString(", BootService");
    if (attributes & NVRAM_VSS_VARIABLE_RUNTIME_ACCESS)                        str += UString(", Runtime");
    if (attributes & NVRAM_VSS_VARIABLE_HARDWARE_ERROR_RECORD)                 str += UString(", HwErrorRecord");
    if (attributes & NVRAM_VSS_VARIABLE_AUTHENTICATED_WRITE_ACCESS)            str += UString(", AuthWrite");
    if (attributes & NVRAM_VSS_VARIABLE_TIME_BASED_AUTHENTICATED_WRITE_ACCESS) str += UString(", TimeBasedAuthWrite");
    if (attributes & NVRAM_VSS_VARIABLE_APPEND_WRITE)                          str += UString(", AppendWrite");
    if (attributes & NVRAM_VSS_VARIABLE_APPLE_DATA_CHECKSUM)                   str += UString(", AppleChecksum");
    if (attributes & NVRAM_VSS_VARIABLE_UNKNOWN_MASK)                          str += UString(", Unknown");
    
    str.remove(0, 2); // Remove first comma and space
    return str;
}